

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O0

void anon_unknown.dwarf_1ba98::testDeepTiledImage1(string *fileName)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  string *in_RDI;
  Image *img2;
  Header hdr;
  DeepImage img1;
  Vec2<int> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  long local_158;
  allocator<char> *in_stack_fffffffffffffec0;
  Vec2<float> *this;
  Vec2<int> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Vec2<float> local_108;
  Header local_100 [79];
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [32];
  DeepImage local_70 [104];
  string *local_8;
  
  this_00 = (Vec2<int> *)(local_90 + 8);
  local_8 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(this_00,0,0);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  Imath_3_2::Vec2<int>::Vec2((Vec2<int> *)this_01,5,5);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (Vec2<int> *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
             in_stack_fffffffffffffe90);
  Imf_3_2::DeepImage::DeepImage(local_70,(Box *)(local_90 + 0x10),MIPMAP_LEVELS,ROUND_DOWN);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,in_stack_fffffffffffffec0);
  Imf_3_2::Image::insertChannel((string *)local_70,(PixelType)local_b0,1,1,true);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  Imf_3_2::saveImage(local_8,(Image *)local_70);
  this = &local_108;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_100,0x40,0x40,this,0,3);
  plVar3 = (long *)Imf_3_2::loadImage(local_8,local_100);
  if (plVar3 == (long *)0x0) {
    local_158 = 0;
  }
  else {
    local_158 = __dynamic_cast(plVar3,&Imf_3_2::Image::typeinfo,&Imf_3_2::DeepImage::typeinfo,0);
  }
  if (local_158 == 0) {
    __assert_fail("dynamic_cast<DeepImage*> (img2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                  ,0xa4,"void (anonymous namespace)::testDeepTiledImage1(const string &)");
  }
  iVar2 = Imf_3_2::Image::levelMode();
  if (iVar2 != 1) {
    __assert_fail("img2->levelMode () == MIPMAP_LEVELS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                  ,0xa5,"void (anonymous namespace)::testDeepTiledImage1(const string &)");
  }
  iVar2 = Imf_3_2::Image::levelRoundingMode();
  if (iVar2 == 0) {
    bVar1 = Imf_3_2::Header::hasTileDescription();
    if ((bVar1 & 1) == 0) {
      __assert_fail("hdr.hasTileDescription ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                    ,0xa7,"void (anonymous namespace)::testDeepTiledImage1(const string &)");
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
    Imf_3_2::Header::~Header(local_100);
    Imf_3_2::DeepImage::~DeepImage(local_70);
    return;
  }
  __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                ,0xa6,"void (anonymous namespace)::testDeepTiledImage1(const string &)");
}

Assistant:

void
testDeepTiledImage1 (const string& fileName)
{
    DeepImage img1 (Box2i (V2i (0, 0), V2i (5, 5)), MIPMAP_LEVELS, ROUND_DOWN);
    img1.insertChannel ("H", HALF);
    saveImage (fileName, img1);

    Header hdr;
    Image* img2 = loadImage (fileName, hdr);

    assert (dynamic_cast<DeepImage*> (img2));
    assert (img2->levelMode () == MIPMAP_LEVELS);
    assert (img2->levelRoundingMode () == ROUND_DOWN);
    assert (hdr.hasTileDescription ());

    delete img2;
}